

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cMultiBindTests.cpp
# Opt level: O0

int __thiscall gl4cts::MultiBindTests::init(MultiBindTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  MultiBindTests *this_local;
  
  pTVar1 = (TestNode *)operator_new(0x78);
  MultiBind::DispatchBindTexturesTest::DispatchBindTexturesTest
            ((DispatchBindTexturesTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  MultiBind::ErrorsBindBuffersTest::ErrorsBindBuffersTest
            ((ErrorsBindBuffersTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  MultiBind::ErrorsBindTexturesTest::ErrorsBindTexturesTest
            ((ErrorsBindTexturesTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  MultiBind::ErrorsBindSamplersTest::ErrorsBindSamplersTest
            ((ErrorsBindSamplersTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  MultiBind::ErrorsBindImageTexturesTest::ErrorsBindImageTexturesTest
            ((ErrorsBindImageTexturesTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  MultiBind::ErrorsBindVertexBuffersTest::ErrorsBindVertexBuffersTest
            ((ErrorsBindVertexBuffersTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  MultiBind::FunctionalBindBuffersBaseTest::FunctionalBindBuffersBaseTest
            ((FunctionalBindBuffersBaseTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  MultiBind::FunctionalBindBuffersRangeTest::FunctionalBindBuffersRangeTest
            ((FunctionalBindBuffersRangeTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  MultiBind::FunctionalBindTexturesTest::FunctionalBindTexturesTest
            ((FunctionalBindTexturesTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  MultiBind::FunctionalBindSamplersTest::FunctionalBindSamplersTest
            ((FunctionalBindSamplersTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  MultiBind::FunctionalBindImageTexturesTest::FunctionalBindImageTexturesTest
            ((FunctionalBindImageTexturesTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  MultiBind::FunctionalBindVertexBuffersTest::FunctionalBindVertexBuffersTest
            ((FunctionalBindVertexBuffersTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  MultiBind::DispatchBindBuffersBaseTest::DispatchBindBuffersBaseTest
            ((DispatchBindBuffersBaseTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  MultiBind::DispatchBindBuffersRangeTest::DispatchBindBuffersRangeTest
            ((DispatchBindBuffersRangeTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  MultiBind::DispatchBindImageTexturesTest::DispatchBindImageTexturesTest
            ((DispatchBindImageTexturesTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  MultiBind::DispatchBindSamplersTest::DispatchBindSamplersTest
            ((DispatchBindSamplersTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  MultiBind::DrawBindVertexBuffersTest::DrawBindVertexBuffersTest
            ((DrawBindVertexBuffersTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void MultiBindTests::init(void)
{
	addChild(new MultiBind::DispatchBindTexturesTest(m_context));

	addChild(new MultiBind::ErrorsBindBuffersTest(m_context));
	addChild(new MultiBind::ErrorsBindTexturesTest(m_context));
	addChild(new MultiBind::ErrorsBindSamplersTest(m_context));
	addChild(new MultiBind::ErrorsBindImageTexturesTest(m_context));
	addChild(new MultiBind::ErrorsBindVertexBuffersTest(m_context));
	addChild(new MultiBind::FunctionalBindBuffersBaseTest(m_context));
	addChild(new MultiBind::FunctionalBindBuffersRangeTest(m_context));
	addChild(new MultiBind::FunctionalBindTexturesTest(m_context));
	addChild(new MultiBind::FunctionalBindSamplersTest(m_context));
	addChild(new MultiBind::FunctionalBindImageTexturesTest(m_context));
	addChild(new MultiBind::FunctionalBindVertexBuffersTest(m_context));
	addChild(new MultiBind::DispatchBindBuffersBaseTest(m_context));
	addChild(new MultiBind::DispatchBindBuffersRangeTest(m_context));

	addChild(new MultiBind::DispatchBindImageTexturesTest(m_context));
	addChild(new MultiBind::DispatchBindSamplersTest(m_context));
	addChild(new MultiBind::DrawBindVertexBuffersTest(m_context));
}